

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>_>
* Lib::
  concatIters<Lib::VirtualIterator<Indexing::TermLiteralClause>,Lib::VirtualIterator<Indexing::TermLiteralClause>>
            (VirtualIterator<Indexing::TermLiteralClause> *i1,
            VirtualIterator<Indexing::TermLiteralClause> *i2)

{
  VirtualIterator<Indexing::TermLiteralClause> *in_RDX;
  VirtualIterator<Indexing::TermLiteralClause> *in_RSI;
  CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
  *in_RDI;
  CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
  *this;
  IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_> *in_stack_ffffffffffffffb0;
  VirtualIterator<Indexing::TermLiteralClause> in_stack_ffffffffffffffb8;
  CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
  *in_stack_ffffffffffffffc0;
  VirtualIterator<Indexing::TermLiteralClause> in_stack_ffffffffffffffc8;
  
  this = in_RDI;
  VirtualIterator<Indexing::TermLiteralClause>::VirtualIterator
            ((VirtualIterator<Indexing::TermLiteralClause> *)&stack0xffffffffffffffc8,in_RSI);
  VirtualIterator<Indexing::TermLiteralClause>::VirtualIterator
            ((VirtualIterator<Indexing::TermLiteralClause> *)&stack0xffffffffffffffb8,in_RDX);
  concatIters<Lib::VirtualIterator<Indexing::TermLiteralClause>>
            ((VirtualIterator<Indexing::TermLiteralClause> *)in_stack_ffffffffffffffb8._core);
  CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
  ::CatIterator(in_stack_ffffffffffffffc0,
                (VirtualIterator<Indexing::TermLiteralClause> *)in_stack_ffffffffffffffb8._core,
                in_stack_ffffffffffffffb0);
  iterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>>>>
            ((CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
              *)in_stack_ffffffffffffffc8._core);
  CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>
  ::~CatIterator(this);
  IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>::~IterTraits
            ((IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_> *)0x7f03ec);
  VirtualIterator<Indexing::TermLiteralClause>::~VirtualIterator
            ((VirtualIterator<Indexing::TermLiteralClause> *)this);
  VirtualIterator<Indexing::TermLiteralClause>::~VirtualIterator
            ((VirtualIterator<Indexing::TermLiteralClause> *)this);
  return (IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::TermLiteralClause>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::TermLiteralClause>_>_>_>
          *)in_RDI;
}

Assistant:

static auto concatIters(I1 i1, I2 i2, Is... is) 
{ return iterTraits(CatIterator<I1, decltype(concatIters(std::move(i2), std::move(is)...))>(std::move(i1), concatIters(std::move(i2), std::move(is)...))); }